

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<const_char_*,_const_char_*,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_testing::internal::CastAndAppendTransform<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>_>
::
IterateOverTuple<std::tuple<const_char_*,_const_char_*,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_2UL>
::operator()(undefined8 param_1,long param_2,
            vector<testing::Matcher<std::__cxx11::string_const&>,std::allocator<testing::Matcher<std::__cxx11::string_const&>>>
            *param_3)

{
  back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
  bVar1;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_30,(string *)(param_2 + 8));
  std::
  vector<testing::Matcher<std::__cxx11::string_const&>,std::allocator<testing::Matcher<std::__cxx11::string_const&>>>
  ::emplace_back<testing::Matcher<std::__cxx11::string_const&>>
            (param_3,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&local_30);
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_30);
  bVar1 = IterateOverTuple<std::tuple<const_char_*,_const_char_*,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_1UL>
          ::operator()((IterateOverTuple<std::tuple<const_char_*,_const_char_*,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_1UL>
                        *)&local_30,param_2,param_3);
  return (back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator() (Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }